

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transport.cpp
# Opt level: O0

void __thiscall
adios2::Transport::OpenChain
          (Transport *this,string *name,Mode openMode,Comm *chainComm,bool async,bool directio)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  undefined4 in_EDX;
  byte in_R8B;
  byte in_R9B;
  undefined4 in_stack_fffffffffffffed8;
  string local_f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  invalid_argument local_38 [22];
  byte local_22;
  byte local_21;
  
  local_21 = in_R8B & 1;
  local_22 = in_R9B & 1;
  std::operator+(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_EDX,in_stack_fffffffffffffed8),(char *)in_RCX);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_EDX,in_stack_fffffffffffffed8),in_RCX);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_EDX,in_stack_fffffffffffffed8),(char *)in_RCX);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_EDX,in_stack_fffffffffffffed8),in_RCX);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_EDX,in_stack_fffffffffffffed8),(char *)in_RCX);
  std::invalid_argument::invalid_argument(local_38,local_58);
  std::invalid_argument::~invalid_argument(local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_f8);
  return;
}

Assistant:

void Transport::OpenChain(const std::string &name, const Mode openMode,
                          const helper::Comm &chainComm, const bool async, const bool directio)
{
    std::invalid_argument("ERROR: " + m_Name + " transport type " + m_Type + " using library " +
                          m_Library + " doesn't implement the OpenChain function\n");
}